

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aggregate_executor.hpp
# Opt level: O1

void duckdb::AggregateExecutor::
     UnaryUpdate<duckdb::KurtosisState,double,duckdb::KurtosisOperation<duckdb::KurtosisFlagNoBiasCorrection>>
               (Vector *input,AggregateInputData *aggr_input_data,data_ptr_t state,idx_t count)

{
  unsigned_long *puVar1;
  data_ptr_t pdVar2;
  long lVar3;
  sel_t *psVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  ulong uVar10;
  ulong uVar11;
  ulong uVar12;
  ulong uVar13;
  unsigned_long uVar14;
  long lVar15;
  double dVar16;
  double dVar17;
  double dVar18;
  double dVar19;
  double dVar20;
  AggregateUnaryInput input_data;
  double local_f8;
  double dStack_f0;
  double dStack_e0;
  UnifiedVectorFormat local_78;
  
  if (input->vector_type == FLAT_VECTOR) {
    pdVar2 = input->data;
    FlatVector::VerifyFlatVector(input);
    if (0x3f < count + 0x3f) {
      uVar10 = 0;
      uVar13 = 0;
      do {
        puVar1 = (input->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
        if (puVar1 == (unsigned_long *)0x0) {
          uVar14 = 0xffffffffffffffff;
        }
        else {
          uVar14 = puVar1[uVar10];
        }
        uVar11 = uVar13 + 0x40;
        if (count <= uVar13 + 0x40) {
          uVar11 = count;
        }
        uVar12 = uVar11;
        if (uVar14 != 0) {
          uVar12 = uVar13;
          if (uVar14 == 0xffffffffffffffff) {
            lVar15 = uVar11 - uVar13;
            if (uVar13 <= uVar11 && lVar15 != 0) {
              lVar3 = *(long *)state;
              dVar17 = *(double *)(state + 8);
              dVar20 = *(double *)(state + 0x10);
              dVar18 = *(double *)(state + 0x18);
              dStack_e0 = *(double *)(state + 0x20);
              do {
                auVar7._8_4_ = SUB84(dStack_e0,0);
                auVar7._0_8_ = dVar18;
                auVar7._12_4_ = (int)((ulong)dStack_e0 >> 0x20);
                dVar19 = *(double *)(pdVar2 + uVar13 * 8);
                dVar17 = dVar17 + dVar19;
                dVar20 = dVar20 + dVar19 * dVar19;
                dVar16 = pow(dVar19,3.0);
                dVar19 = pow(dVar19,4.0);
                dStack_e0 = auVar7._8_8_;
                dVar18 = dVar18 + dVar16;
                dStack_e0 = dStack_e0 + dVar19;
                uVar13 = uVar13 + 1;
              } while (uVar11 != uVar13);
              *(long *)state = lVar15 + lVar3;
              *(double *)(state + 8) = dVar17;
              *(double *)(state + 0x10) = dVar20;
              auVar8._8_4_ = SUB84(dStack_e0,0);
              auVar8._0_8_ = dVar18;
              auVar8._12_4_ = (int)((ulong)dStack_e0 >> 0x20);
              *(undefined1 (*) [16])(state + 0x18) = auVar8;
              uVar12 = uVar13;
            }
          }
          else if (uVar13 < uVar11) {
            uVar12 = 0;
            do {
              if ((uVar14 >> (uVar12 & 0x3f) & 1) != 0) {
                *(long *)state = *(long *)state + 1;
                dVar18 = *(double *)(pdVar2 + uVar12 * 8 + uVar13 * 8);
                dVar17 = dVar18 * dVar18 + *(double *)(state + 0x10);
                auVar9._8_4_ = SUB84(dVar17,0);
                auVar9._0_8_ = dVar18 + *(double *)(state + 8);
                auVar9._12_4_ = (int)((ulong)dVar17 >> 0x20);
                *(undefined1 (*) [16])(state + 8) = auVar9;
                dVar17 = pow(dVar18,3.0);
                dVar18 = pow(dVar18,4.0);
                *(double *)(state + 0x18) = dVar17 + *(double *)(state + 0x18);
                *(double *)(state + 0x20) = dVar18 + *(double *)(state + 0x20);
              }
              uVar12 = uVar12 + 1;
            } while ((uVar13 - uVar11) + uVar12 != 0);
            uVar12 = uVar13 + uVar12;
          }
        }
        uVar10 = uVar10 + 1;
        uVar13 = uVar12;
      } while (uVar10 != count + 0x3f >> 6);
    }
  }
  else if (input->vector_type == CONSTANT_VECTOR) {
    puVar1 = (input->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
    if ((puVar1 == (unsigned_long *)0x0) || ((*puVar1 & 1) != 0)) {
      local_78.data = (data_ptr_t)&input->validity;
      local_78.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask =
           (unsigned_long *)0x0;
      local_78.sel = (SelectionVector *)aggr_input_data;
      KurtosisOperation<duckdb::KurtosisFlagNoBiasCorrection>::
      ConstantOperation<double,duckdb::KurtosisState,duckdb::KurtosisOperation<duckdb::KurtosisFlagNoBiasCorrection>>
                ((KurtosisState *)state,(double *)input->data,(AggregateUnaryInput *)&local_78,count
                );
    }
  }
  else {
    UnifiedVectorFormat::UnifiedVectorFormat(&local_78);
    Vector::ToUnifiedFormat(input,count,&local_78);
    if (local_78.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
        (unsigned_long *)0x0) {
      if (count != 0) {
        psVar4 = (local_78.sel)->sel_vector;
        lVar15 = *(long *)state;
        local_f8 = *(double *)(state + 8);
        dStack_f0 = *(double *)(state + 0x10);
        dVar18 = *(double *)(state + 0x18);
        dVar17 = *(double *)(state + 0x20);
        uVar13 = 0;
        do {
          uVar10 = uVar13;
          if (psVar4 != (sel_t *)0x0) {
            uVar10 = (ulong)psVar4[uVar13];
          }
          dVar20 = *(double *)(local_78.data + uVar10 * 8);
          local_f8 = local_f8 + dVar20;
          dStack_f0 = dStack_f0 + dVar20 * dVar20;
          dVar19 = pow(dVar20,3.0);
          dVar20 = pow(dVar20,4.0);
          dVar18 = dVar18 + dVar19;
          dVar17 = dVar17 + dVar20;
          uVar13 = uVar13 + 1;
        } while (count != uVar13);
        *(idx_t *)state = lVar15 + count;
        *(double *)(state + 8) = local_f8;
        *(double *)(state + 0x10) = dStack_f0;
        *(double *)(state + 0x18) = dVar18;
        *(double *)(state + 0x20) = dVar17;
      }
    }
    else if (count != 0) {
      psVar4 = (local_78.sel)->sel_vector;
      uVar13 = 0;
      do {
        uVar10 = uVar13;
        if (psVar4 != (sel_t *)0x0) {
          uVar10 = (ulong)psVar4[uVar13];
        }
        if ((local_78.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
             (unsigned_long *)0x0) ||
           ((local_78.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask[uVar10 >> 6]
             >> (uVar10 & 0x3f) & 1) != 0)) {
          *(long *)state = *(long *)state + 1;
          dVar18 = *(double *)(local_78.data + uVar10 * 8);
          dVar17 = dVar18 * dVar18 + *(double *)(state + 0x10);
          auVar5._8_4_ = SUB84(dVar17,0);
          auVar5._0_8_ = dVar18 + *(double *)(state + 8);
          auVar5._12_4_ = (int)((ulong)dVar17 >> 0x20);
          *(undefined1 (*) [16])(state + 8) = auVar5;
          dVar17 = pow(dVar18,3.0);
          dVar18 = pow(dVar18,4.0);
          auVar6._8_4_ = SUB84(dVar18 + *(double *)(state + 0x20),0);
          auVar6._0_8_ = dVar17 + *(double *)(state + 0x18);
          auVar6._12_4_ = (int)((ulong)(dVar18 + *(double *)(state + 0x20)) >> 0x20);
          *(undefined1 (*) [16])(state + 0x18) = auVar6;
        }
        uVar13 = uVar13 + 1;
      } while (count != uVar13);
    }
    if (local_78.owned_sel.selection_data.internal.
        super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_78.owned_sel.selection_data.internal.
                 super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                 _M_pi);
    }
    if (local_78.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
        super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
        ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_78.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal
                 .
                 super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                 ._M_refcount._M_pi);
    }
  }
  return;
}

Assistant:

static void UnaryUpdate(Vector &input, AggregateInputData &aggr_input_data, data_ptr_t state, idx_t count) {
		switch (input.GetVectorType()) {
		case VectorType::CONSTANT_VECTOR: {
			if (OP::IgnoreNull() && ConstantVector::IsNull(input)) {
				return;
			}
			auto idata = ConstantVector::GetData<INPUT_TYPE>(input);
			AggregateUnaryInput input_data(aggr_input_data, ConstantVector::Validity(input));
			OP::template ConstantOperation<INPUT_TYPE, STATE_TYPE, OP>(*reinterpret_cast<STATE_TYPE *>(state), *idata,
			                                                           input_data, count);
			break;
		}
#ifndef DUCKDB_SMALLER_BINARY
		case VectorType::FLAT_VECTOR: {
			auto idata = FlatVector::GetData<INPUT_TYPE>(input);
			UnaryFlatUpdateLoop<STATE_TYPE, INPUT_TYPE, OP>(idata, aggr_input_data, (STATE_TYPE *)state, count,
			                                                FlatVector::Validity(input));
			break;
		}
#endif
		default: {
			UnifiedVectorFormat idata;
			input.ToUnifiedFormat(count, idata);
			UnaryUpdateLoop<STATE_TYPE, INPUT_TYPE, OP>(UnifiedVectorFormat::GetData<INPUT_TYPE>(idata),
			                                            aggr_input_data, (STATE_TYPE *)state, count, idata.validity,
			                                            *idata.sel);
			break;
		}
		}
	}